

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O1

void convert_mods(iasctx *ctx,easm_mods *mods)

{
  int iVar1;
  litem *plVar2;
  litem **pplVar3;
  int iVar4;
  long lVar5;
  
  if (0 < mods->modsnum) {
    lVar5 = 0;
    do {
      plVar2 = (litem *)calloc(0x20,1);
      plVar2->type = LITEM_NAME;
      plVar2->str = mods->mods[lVar5]->str;
      iVar1 = ctx->atomsmax;
      if (iVar1 <= ctx->atomsnum) {
        iVar4 = iVar1 * 2;
        if (iVar1 == 0) {
          iVar4 = 0x10;
        }
        ctx->atomsmax = iVar4;
        pplVar3 = (litem **)realloc(ctx->atoms,(long)iVar4 << 3);
        ctx->atoms = pplVar3;
      }
      iVar1 = ctx->atomsnum;
      ctx->atomsnum = iVar1 + 1;
      ctx->atoms[iVar1] = plVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 < mods->modsnum);
  }
  return;
}

Assistant:

void convert_mods(struct iasctx *ctx, struct easm_mods *mods) {
	int i;
	for (i = 0; i < mods->modsnum; i++) {
		struct litem *li = calloc(sizeof *li, 1);
		li->type = LITEM_NAME;
		li->str = mods->mods[i]->str;
		ADDARRAY(ctx->atoms, li);
	}
}